

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxShift::Emit(FxShift *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  byte bVar2;
  FxExpression *pFVar3;
  PString *pPVar4;
  uint uVar5;
  int iVar6;
  uint extraout_var;
  uint extraout_var_00;
  VM_UBYTE *pVVar7;
  uint uVar8;
  FScriptPosition *other;
  uint uVar9;
  ExpEmit EVar10;
  uint uVar11;
  FString local_38;
  
  pFVar3 = (this->super_FxBinary).left;
  if (pFVar3->ValueType->RegType != '\0') {
    __assert_fail("left->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xeb9,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  if (((this->super_FxBinary).right)->ValueType->RegType != '\0') {
    __assert_fail("right->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xeba,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  iVar6 = (this->super_FxBinary).Operator;
  if (iVar6 == 0x116) {
    uVar9 = 1;
  }
  else {
    uVar9 = 0;
    if (iVar6 != 0x118) {
      uVar9 = (uint)(iVar6 == 0x117) * 3 - 1;
    }
  }
  if ((int)uVar9 < 0) {
    __assert_fail("index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xec7,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  uVar5 = (*pFVar3->_vptr_FxExpression[9])(pFVar3,build);
  iVar6 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
  if ((char)iVar6 == '\0') {
    pFVar3 = (this->super_FxBinary).right;
    uVar8 = (*pFVar3->_vptr_FxExpression[9])(pFVar3,build);
    if ((extraout_var_00 & 1) != 0) {
      __assert_fail("!op2.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xed3,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
    }
    if ((CONCAT44(extraout_var_00,uVar8) & 0x10000fc0000) == 0) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var_00,uVar8) >> 0x10) & 3),
                 uVar8 & 0xffff,uVar8 >> 0x18);
    }
    uVar8 = uVar8 & 0xffff;
    uVar11 = extraout_var_00;
  }
  else {
    pFVar3 = (this->super_FxBinary).right;
    pPVar4 = (PString *)pFVar3[1]._vptr_FxExpression;
    other = &pFVar3[1].ScriptPosition;
    if (pPVar4 == TypeString) {
      FString::AttachToOther(&local_38,&other->FileName);
    }
    else {
      local_38.Chars = (other->FileName).Chars;
    }
    BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      uVar8 = (uint)(double)local_38.Chars;
    }
    else {
      uVar8 = 0;
      if (BVar1 == '\0') {
        uVar8 = (uint)local_38.Chars;
      }
    }
    if (pPVar4 == TypeString) {
      FString::~FString(&local_38);
    }
    uVar11 = 1;
  }
  if ((extraout_var & 1) == 0) {
    if ((CONCAT44(extraout_var,uVar5) & 0x10000fc0000) == 0) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(CONCAT44(extraout_var,uVar5) >> 0x10) & 3),
                 uVar5 & 0xffff,uVar5 >> 0x18);
    }
    pVVar7 = Emit::InstrMap[uVar9] + (ulong)(uVar11 & 1) * 2;
  }
  else {
    if ((uVar11 & 1) != 0) {
      __assert_fail("!op2.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xedf,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
    }
    pVVar7 = Emit::InstrMap[uVar9] + 1;
  }
  bVar2 = *pVVar7;
  if (bVar2 != 0) {
    uVar9 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    VMFunctionBuilder::Emit(build,(uint)bVar2,uVar9 & 0xffff,uVar5 & 0xffff,uVar8);
    EVar10._0_4_ = uVar9 & 0xffff | 0x1000000;
    EVar10.Konst = false;
    EVar10.Fixed = false;
    EVar10.Final = false;
    EVar10.Target = false;
    return EVar10;
  }
  __assert_fail("instr != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0xee2,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxShift::Emit(VMFunctionBuilder *build)
{
	assert(left->ValueType->GetRegType() == REGT_INT);
	assert(right->ValueType->GetRegType() == REGT_INT);
	static const VM_UBYTE InstrMap[][4] =
	{
		{ OP_SLL_RR, OP_SLL_KR, OP_SLL_RI },	// TK_LShift
		{ OP_SRA_RR, OP_SRA_KR, OP_SRA_RI },	// TK_RShift
		{ OP_SRL_RR, OP_SRL_KR, OP_SRL_RI },	// TK_URShift
	};
	int index, instr, rop;
	ExpEmit op1, op2;

	index = Operator == TK_LShift ? 0 :
			Operator == TK_RShift ? 1 :
			Operator == TK_URShift ? 2 : -1;
	assert(index >= 0);
	op1 = left->Emit(build);

	// Shift instructions use right-hand immediates instead of constant registers.
	if (right->isConstant())
	{
		rop = static_cast<FxConstant *>(right)->GetValue().GetInt();
		op2.Konst = true;
	}
	else
	{
		op2 = right->Emit(build);
		assert(!op2.Konst);
		op2.Free(build);
		rop = op2.RegNum;
	}

	if (!op1.Konst)
	{
		op1.Free(build);
		instr = InstrMap[index][op2.Konst? 2:0];
	}
	else
	{
		assert(!op2.Konst);
		instr = InstrMap[index][1];
	}
	assert(instr != 0);
	ExpEmit to(build, REGT_INT);
	build->Emit(instr, to.RegNum, op1.RegNum, rop);
	return to;
}